

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_jmpcc(DisasContext_conflict2 *s,int cond,TCGLabel *l1)

{
  TCGContext_conflict2 *tcg_ctx;
  DisasCompare_conflict c;
  DisasCompare_conflict local_38;
  
  tcg_ctx = s->uc->tcg_ctx;
  gen_cc_cond(&local_38,s,cond);
  update_cc_op(s);
  tcg_gen_brcond_i32_m68k(tcg_ctx,local_38.tcond,local_38.v1,local_38.v2,l1);
  free_cond(tcg_ctx,&local_38);
  return;
}

Assistant:

static void gen_jmpcc(DisasContext *s, int cond, TCGLabel *l1)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    DisasCompare c;

    gen_cc_cond(&c, s, cond);
    update_cc_op(s);
    tcg_gen_brcond_i32(tcg_ctx, c.tcond, c.v1, c.v2, l1);
    free_cond(tcg_ctx, &c);
}